

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_equipment(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  CHAR_DATA *in_RDI;
  OBJ_DATA *obj;
  string buffer;
  OBJ_DATA *tObj;
  int iWear;
  bool found;
  undefined1 in_stack_000000d0 [16];
  undefined1 in_stack_000000e0 [16];
  undefined1 in_stack_fffffffffffffe6f;
  CHAR_DATA *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  string *in_stack_fffffffffffffe80;
  char *local_168;
  OBJ_DATA *in_stack_fffffffffffffea0;
  CHAR_DATA *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  char (*in_stack_fffffffffffffec0) [12];
  undefined1 local_120 [8];
  undefined1 local_118 [16];
  char *local_108 [4];
  OBJ_DATA *local_e8;
  uint local_e0;
  byte local_d9;
  CHAR_DATA *local_d0;
  OBJ_INDEX_DATA *local_c8 [3];
  undefined8 local_b0;
  OBJ_INDEX_DATA **local_a8;
  OBJ_DATA *local_a0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*> *local_90;
  OBJ_DATA *local_88;
  OBJ_DATA *pOStack_80;
  char **local_78;
  char *local_70;
  OBJ_DATA *local_68;
  char *local_60;
  OBJ_DATA *local_58;
  OBJ_DATA **local_50;
  OBJ_DATA *local_48;
  OBJ_INDEX_DATA **local_38;
  undefined8 *local_30;
  OBJ_INDEX_DATA **local_28;
  long local_20;
  undefined8 *local_18;
  OBJ_INDEX_DATA **local_10;
  char *local_8;
  
  local_d0 = in_RDI;
  send_to_char((char *)in_stack_fffffffffffffe80,
               (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  local_d9 = 0;
  for (local_e0 = 0; (int)local_e0 < 0x16; local_e0 = local_e0 + 1) {
    if (local_e0 == 0x10) {
      for (local_e8 = local_d0->carrying; local_e8 != (OBJ_DATA *)0x0;
          local_e8 = local_e8->next_content) {
        if (local_e8->wear_loc == 0x15) {
          in_stack_fffffffffffffea0 = (OBJ_DATA *)local_118;
          local_70 = "{}>";
          local_60 = "{}>";
          local_118._0_8_ = "{}>";
          local_68 = in_stack_fffffffffffffea0;
          local_58 = in_stack_fffffffffffffea0;
          pOVar2 = (OBJ_DATA *)std::char_traits<char>::length((char_type *)0x55098c);
          in_stack_fffffffffffffea0->next_content = pOVar2;
          local_8 = local_70;
          if (local_e8->wear_loc_name == (char *)0x0) {
            local_168 = "bug: unset wear_loc on cosmetic";
          }
          else {
            local_168 = local_e8->wear_loc_name;
          }
          local_120 = (undefined1  [8])local_168;
          local_78 = local_108;
          local_88 = (OBJ_DATA *)local_118._0_8_;
          pOStack_80 = (OBJ_DATA *)local_118._8_8_;
          local_90 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*>
                      *)local_120;
          local_50 = &local_88;
          local_a0 = (OBJ_DATA *)local_118._0_8_;
          local_48 = local_a0;
          local_c8[0] = (OBJ_INDEX_DATA *)
                        fmt::v9::
                        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const*&>
                                  (local_90,(v9 *)in_RDI,local_78);
          local_30 = &local_b0;
          local_38 = local_c8;
          local_20 = 0xc;
          local_b0._0_1_ = true;
          local_b0._1_1_ = false;
          local_b0._2_6_ = 0;
          local_28 = local_38;
          local_18 = local_30;
          local_10 = local_38;
          local_a8 = local_38;
          fmt::v9::vformat_abi_cxx11_((string_view)in_stack_000000e0,(format_args)in_stack_000000d0)
          ;
          fmt::v9::sprintf<char[12],std::__cxx11::string,char>
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          in_stack_fffffffffffffe80 = (string *)&stack0xfffffffffffffec0;
          std::__cxx11::string::operator=((string *)local_108,in_stack_fffffffffffffe80);
          std::__cxx11::string::~string(in_stack_fffffffffffffe80);
          std::__cxx11::string::c_str();
          send_to_char((char *)in_stack_fffffffffffffe80,
                       (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
          in_stack_fffffffffffffe7f =
               can_see_obj(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
          if ((bool)in_stack_fffffffffffffe7f) {
            in_stack_fffffffffffffe70 =
                 (CHAR_DATA *)
                 format_obj_to_char((OBJ_DATA *)
                                    CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                    in_stack_fffffffffffffe70,(bool)in_stack_fffffffffffffe6f);
            send_to_char((char *)in_stack_fffffffffffffe80,
                         (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78))
            ;
          }
          else {
            send_to_char((char *)in_stack_fffffffffffffe80,
                         (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78))
            ;
          }
          in_RDI = local_d0;
          send_to_char((char *)in_stack_fffffffffffffe80,
                       (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
          local_d9 = 1;
          std::__cxx11::string::~string((string *)local_108);
        }
      }
    }
    in_RDI = (CHAR_DATA *)(ulong)local_e0;
    in_stack_fffffffffffffea8 = (CHAR_DATA *)get_eq_char(local_d0,local_e0);
    if ((local_e0 != 0x15) && (in_stack_fffffffffffffea8 != (CHAR_DATA *)0x0)) {
      send_to_char((char *)in_stack_fffffffffffffe80,
                   (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      bVar1 = can_see_obj(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      if (bVar1) {
        format_obj_to_char((OBJ_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)
                           ,in_stack_fffffffffffffe70,(bool)in_stack_fffffffffffffe6f);
        send_to_char((char *)in_stack_fffffffffffffe80,
                     (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      }
      else {
        send_to_char((char *)in_stack_fffffffffffffe80,
                     (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      }
      in_RDI = local_d0;
      send_to_char((char *)in_stack_fffffffffffffe80,
                   (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      local_d9 = 1;
    }
  }
  if ((local_d9 & 1) == 0) {
    send_to_char((char *)in_stack_fffffffffffffe80,
                 (CHAR_DATA *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  }
  return;
}

Assistant:

void do_equipment(CHAR_DATA *ch, char *argument)
{
	send_to_char("You are using:\n\r", ch);

	auto found = false;
	for (auto iWear = 0; iWear < MAX_WEAR; iWear++)
	{
		if (iWear == WEAR_WIELD) // cosmetics come right before "wield" on display
		{
			for (auto tObj = ch->carrying; tObj; tObj = tObj->next_content)
			{
				if (tObj->wear_loc == WEAR_COSMETIC)
				{
					auto buffer = fmt::format("{}>", tObj->wear_loc_name ? tObj->wear_loc_name : "bug: unset wear_loc on cosmetic");
					buffer = fmt::sprintf("<worn %-14s", buffer);
					send_to_char(buffer.c_str(), ch);

					if (can_see_obj(ch, tObj))
						send_to_char(format_obj_to_char(tObj, ch, true), ch);
					else
						send_to_char("something.", ch);

					send_to_char("\n\r", ch);
					found = true;
				}
			}
		}

		auto obj = get_eq_char(ch, iWear);
		if (iWear == WEAR_COSMETIC || obj == nullptr)
			continue;

		send_to_char(where_name[iWear], ch);

		if (can_see_obj(ch, obj))
			send_to_char(format_obj_to_char(obj, ch, true), ch);
		else
			send_to_char("something.", ch);

		send_to_char("\n\r", ch);
		found = true;
	}

	if (!found)
		send_to_char("Nothing.\n\r", ch);
}